

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O3

void XYcZ_add(tc_uECC_word_t *X1,tc_uECC_word_t *Y1,tc_uECC_word_t *X2,tc_uECC_word_t *Y2,
             tc_uECC_Curve curve)

{
  tc_uECC_word_t *mod;
  tc_uECC_word_t *ptVar1;
  char num_words;
  tc_uECC_word_t local_b8 [2];
  tc_uECC_word_t product [16];
  tc_uECC_word_t t5 [8];
  
  num_words = curve->num_words;
  mod = curve->p;
  ptVar1 = product + 0xe;
  tc_uECC_vli_modSub(ptVar1,X2,X1,mod,num_words);
  tc_uECC_vli_mult(local_b8,ptVar1,ptVar1,num_words);
  (*curve->mmod_fast)(ptVar1,local_b8);
  tc_uECC_vli_mult(local_b8,X1,ptVar1,curve->num_words);
  (*curve->mmod_fast)(X1,local_b8);
  tc_uECC_vli_mult(local_b8,X2,ptVar1,curve->num_words);
  (*curve->mmod_fast)(X2,local_b8);
  tc_uECC_vli_modSub(Y2,Y2,Y1,mod,num_words);
  tc_uECC_vli_mult(local_b8,Y2,Y2,curve->num_words);
  ptVar1 = product + 0xe;
  (*curve->mmod_fast)(ptVar1,local_b8);
  tc_uECC_vli_modSub(ptVar1,ptVar1,X1,mod,num_words);
  tc_uECC_vli_modSub(product + 0xe,product + 0xe,X2,mod,num_words);
  tc_uECC_vli_modSub(X2,X2,X1,mod,num_words);
  tc_uECC_vli_mult(local_b8,Y1,X2,curve->num_words);
  (*curve->mmod_fast)(Y1,local_b8);
  tc_uECC_vli_modSub(X2,X1,product + 0xe,mod,num_words);
  tc_uECC_vli_mult(local_b8,Y2,X2,curve->num_words);
  (*curve->mmod_fast)(Y2,local_b8);
  tc_uECC_vli_modSub(Y2,Y2,Y1,mod,num_words);
  if (0 < num_words) {
    memcpy(X2,product + 0xe,(long)(int)num_words << 2);
  }
  return;
}

Assistant:

void XYcZ_add(tc_uECC_word_t * X1, tc_uECC_word_t * Y1,
	      tc_uECC_word_t * X2, tc_uECC_word_t * Y2,
	      tc_uECC_Curve curve)
{
	/* t1 = X1, t2 = Y1, t3 = X2, t4 = Y2 */
	tc_uECC_word_t t5[NUM_ECC_WORDS];
	wordcount_t num_words = curve->num_words;

	tc_uECC_vli_modSub(t5, X2, X1, curve->p, num_words); /* t5 = x2 - x1 */
	tc_uECC_vli_modSquare_fast(t5, t5, curve); /* t5 = (x2 - x1)^2 = A */
	tc_uECC_vli_modMult_fast(X1, X1, t5, curve); /* t1 = x1*A = B */
	tc_uECC_vli_modMult_fast(X2, X2, t5, curve); /* t3 = x2*A = C */
	tc_uECC_vli_modSub(Y2, Y2, Y1, curve->p, num_words); /* t4 = y2 - y1 */
	tc_uECC_vli_modSquare_fast(t5, Y2, curve); /* t5 = (y2 - y1)^2 = D */

	tc_uECC_vli_modSub(t5, t5, X1, curve->p, num_words); /* t5 = D - B */
	tc_uECC_vli_modSub(t5, t5, X2, curve->p, num_words); /* t5 = D - B - C = x3 */
	tc_uECC_vli_modSub(X2, X2, X1, curve->p, num_words); /* t3 = C - B */
	tc_uECC_vli_modMult_fast(Y1, Y1, X2, curve); /* t2 = y1*(C - B) */
	tc_uECC_vli_modSub(X2, X1, t5, curve->p, num_words); /* t3 = B - x3 */
	tc_uECC_vli_modMult_fast(Y2, Y2, X2, curve); /* t4 = (y2 - y1)*(B - x3) */
	tc_uECC_vli_modSub(Y2, Y2, Y1, curve->p, num_words); /* t4 = y3 */

	tc_uECC_vli_set(X2, t5, num_words);
}